

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.h
# Opt level: O2

bool __thiscall
pybind11::detail::type_caster_holder<Job,_std::shared_ptr<Job>_>::load
          (type_caster_holder<Job,_std::shared_ptr<Job>_> *this,handle src,bool convert,
          PyTypeObject *tobj)

{
  type_info *ptVar1;
  pointer pp_Var2;
  unsigned_long uVar3;
  bool bVar4;
  int iVar5;
  internals *piVar6;
  const_iterator cVar7;
  handle hVar8;
  _func__object_ptr__object_ptr__typeobject_ptr **converter;
  pointer pp_Var9;
  bool bVar10;
  tuple parents;
  iterator __begin5;
  iterator __end5;
  object local_70;
  PyObject *local_68;
  iterator local_60;
  iterator local_48;
  
  ptVar1 = (this->super_type_caster_base<Job>).super_type_caster_generic.typeinfo;
  if (ptVar1 == (type_info *)0x0 || src.m_ptr == (PyObject *)0x0) {
LAB_0010e7d0:
    bVar4 = false;
  }
  else {
    if (src.m_ptr == (PyObject *)&_Py_NoneStruct) {
      (this->super_type_caster_base<Job>).super_type_caster_generic.value = (void *)0x0;
      return true;
    }
    local_68 = src.m_ptr;
    if (ptVar1->simple_type == true) {
      iVar5 = PyType_IsSubtype(tobj);
      if (iVar5 != 0) {
LAB_0010e8e1:
        bVar4 = load_value_and_holder(this,src);
        return bVar4;
      }
      if (!convert) goto LAB_0010e7d0;
    }
    else {
      if (ptVar1->type == tobj) goto LAB_0010e8e1;
      piVar6 = get_internals();
      uVar3 = ((tobj->ob_base).ob_base.ob_type)->tp_flags;
      local_60.super_object.super_handle.m_ptr = (handle)(handle)tobj;
      cVar7 = std::
              _Hashtable<const_void_*,_std::pair<const_void_*const,_void_*>,_std::allocator<std::pair<const_void_*const,_void_*>_>,_std::__detail::_Select1st,_std::equal_to<const_void_*>,_std::hash<const_void_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
              ::find(&(piVar6->registered_types_py)._M_h,(key_type *)&local_60);
      if ((((int)uVar3 < 0) &&
          (cVar7.super__Node_iterator_base<std::pair<const_void_*const,_void_*>,_false>._M_cur ==
           (__node_type *)0x0)) && (hVar8.m_ptr = tobj->tp_bases, hVar8.m_ptr != (PyObject *)0x0)) {
        (hVar8.m_ptr)->ob_refcnt = (hVar8.m_ptr)->ob_refcnt + 1;
        local_70.super_handle.m_ptr = (handle)(handle)hVar8.m_ptr;
        local_60.super_object.super_handle.m_ptr = (handle)PyObject_GetIter();
        local_60.ready = false;
        local_60.value.super_handle.m_ptr = (handle)(PyObject *)0x0;
        local_48.ready = false;
        local_48.super_object.super_handle.m_ptr = (handle)(PyObject *)0x0;
        local_48.value.super_handle.m_ptr = (handle)(PyObject *)0x0;
        while (bVar4 = iterator::operator!=(&local_60,&local_48), bVar4) {
          hVar8 = iterator::operator*(&local_60);
          bVar4 = load(this,src,convert,(PyTypeObject *)hVar8.m_ptr);
          if (bVar4) {
            iterator::~iterator(&local_48);
            iterator::~iterator(&local_60);
            object::~object(&local_70);
            return true;
          }
          iterator::operator++(&local_60);
        }
        iterator::~iterator(&local_48);
        iterator::~iterator(&local_60);
        object::~object(&local_70);
      }
      bVar4 = try_implicit_casts<std::shared_ptr<Job>,_0>(this,src,convert);
      if (!convert || bVar4) {
        return bVar4;
      }
    }
    ptVar1 = (this->super_type_caster_base<Job>).super_type_caster_generic.typeinfo;
    pp_Var9 = (ptVar1->implicit_conversions).
              super__Vector_base<_object_*(*)(_object_*,__typeobject_*),_std::allocator<_object_*(*)(_object_*,__typeobject_*)>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pp_Var2 = *(pointer *)
               ((long)&(ptVar1->implicit_conversions).
                       super__Vector_base<_object_*(*)(_object_*,__typeobject_*),_std::allocator<_object_*(*)(_object_*,__typeobject_*)>_>
                       ._M_impl.super__Vector_impl_data + 8);
    do {
      bVar10 = pp_Var9 == pp_Var2;
      bVar4 = !bVar10;
      if (bVar10) {
        return bVar4;
      }
      local_60.super_object.super_handle.m_ptr =
           (handle)(**pp_Var9)(local_68,((this->super_type_caster_base<Job>).
                                         super_type_caster_generic.typeinfo)->type);
      object::operator=(&(this->super_type_caster_base<Job>).super_type_caster_generic.temp,
                        &local_60.super_object);
      object::~object(&local_60.super_object);
      bVar10 = load(this,(this->super_type_caster_base<Job>).super_type_caster_generic.temp.
                         super_handle.m_ptr,false);
      pp_Var9 = pp_Var9 + 1;
    } while (!bVar10);
  }
  return bVar4;
}

Assistant:

bool load(handle src, bool convert, PyTypeObject *tobj) {
        if (!src || !typeinfo)
            return false;
        if (src.is_none()) {
            value = nullptr;
            return true;
        }

        if (typeinfo->simple_type) { /* Case 1: no multiple inheritance etc. involved */
            /* Check if we can safely perform a reinterpret-style cast */
            if (PyType_IsSubtype(tobj, typeinfo->type))
                return load_value_and_holder(src);
        } else { /* Case 2: multiple inheritance */
            /* Check if we can safely perform a reinterpret-style cast */
            if (tobj == typeinfo->type)
                return load_value_and_holder(src);

            /* If this is a python class, also check the parents recursively */
            auto const &type_dict = get_internals().registered_types_py;
            bool new_style_class = PyType_Check((PyObject *) tobj);
            if (type_dict.find(tobj) == type_dict.end() && new_style_class && tobj->tp_bases) {
                auto parents = reinterpret_borrow<tuple>(tobj->tp_bases);
                for (handle parent : parents) {
                    bool result = load(src, convert, (PyTypeObject *) parent.ptr());
                    if (result)
                        return true;
                }
            }

            if (try_implicit_casts(src, convert))
                return true;
        }

        if (convert) {
            for (auto &converter : typeinfo->implicit_conversions) {
                temp = reinterpret_steal<object>(converter(src.ptr(), typeinfo->type));
                if (load(temp, false))
                    return true;
            }
        }

        return false;
    }